

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.hpp
# Opt level: O1

void van_kampen::utility::
     print<int_const&,char_const(&)[2],std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,char_const(&)[4]>
               (ostream *os,int *args,char (*args_1) [2],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4,
               char (*args_5) [4])

{
  ostream *poVar1;
  size_t sVar2;
  
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)os,*args);
  sVar2 = strlen(*args_1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,*args_1,sVar2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(args_2->_M_dataplus)._M_p,args_2->_M_string_length);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(args_3->_M_dataplus)._M_p,args_3->_M_string_length);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(args_4->_M_dataplus)._M_p,args_4->_M_string_length);
  sVar2 = strlen(*args_5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,*args_5,sVar2);
  std::ostream::flush();
  return;
}

Assistant:

void print(std::ostream &os, ToPrint &&... args)
        {
            (os << ... << args);
            os.flush();
        }